

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void re2::FactorAlternationImpl::Round1
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  uint uVar1;
  Rune *pRVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint nrunes;
  ParseFlags runeflags_i;
  int nrune_i;
  Regexp *prefix;
  ParseFlags local_74;
  ParseFlags local_70;
  uint local_6c;
  Rune *local_68;
  int local_5c;
  long local_58;
  vector<re2::Splice,std::allocator<re2::Splice>> *local_50;
  ulong local_48;
  Regexp **local_40;
  Regexp *local_38;
  
  lVar5 = (long)nsub;
  uVar6 = 0;
  uVar8 = 0;
  local_68 = (Rune *)0x0;
  nrunes = 0;
  local_74 = NoParseFlags;
  local_58 = lVar5;
  local_50 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
  do {
    if (lVar5 < (long)uVar6) {
      return;
    }
    local_6c = 0;
    local_70 = NoParseFlags;
    if ((long)uVar6 < lVar5) {
      pRVar2 = Regexp::LeadingString(sub[uVar6],(int *)&local_6c,&local_70);
      if (local_70 != local_74) goto LAB_001dd38d;
      uVar1 = local_6c;
      if ((int)nrunes < (int)local_6c) {
        uVar1 = nrunes;
      }
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = 0;
      }
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        if (local_68[uVar4] != pRVar2[uVar4]) {
          uVar3 = uVar4 & 0xffffffff;
          break;
        }
      }
      uVar1 = (uint)uVar3;
      if ((uint)uVar3 == 0) goto LAB_001dd38d;
    }
    else {
      pRVar2 = (Rune *)0x0;
LAB_001dd38d:
      iVar7 = (int)uVar8;
      if (uVar6 != iVar7 + 1 && uVar6 != (uVar8 & 0xffffffff)) {
        local_38 = Regexp::LiteralString(local_68,nrunes,local_74);
        local_48 = uVar8;
        for (lVar5 = (long)iVar7; uVar8 = local_48, lVar5 < (long)uVar6; lVar5 = lVar5 + 1) {
          Regexp::RemoveLeadingString(sub[lVar5],nrunes);
        }
        local_40 = sub + iVar7;
        local_5c = (int)uVar6 - (int)local_48;
        std::vector<re2::Splice,std::allocator<re2::Splice>>::
        emplace_back<re2::Regexp*&,re2::Regexp**,int>(local_50,&local_38,&local_40,&local_5c);
        lVar5 = local_58;
      }
      uVar1 = nrunes;
      if ((long)uVar6 < lVar5) {
        local_74 = local_70;
        uVar8 = uVar6 & 0xffffffff;
        local_68 = pRVar2;
        uVar1 = local_6c;
      }
    }
    nrunes = uVar1;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void FactorAlternationImpl::Round1(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 1: Factor out common literal prefixes.
  int start = 0;
  Rune* rune = NULL;
  int nrune = 0;
  Regexp::ParseFlags runeflags = Regexp::NoParseFlags;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // begin with rune[0:nrune].
    Rune* rune_i = NULL;
    int nrune_i = 0;
    Regexp::ParseFlags runeflags_i = Regexp::NoParseFlags;
    if (i < nsub) {
      rune_i = Regexp::LeadingString(sub[i], &nrune_i, &runeflags_i);
      if (runeflags_i == runeflags) {
        int same = 0;
        while (same < nrune && same < nrune_i && rune[same] == rune_i[same])
          same++;
        if (same > 0) {
          // Matches at least one rune in current range.  Keep going around.
          nrune = same;
          continue;
        }
      }
    }

    // Found end of a run with common leading literal string:
    // sub[start:i] all begin with rune[0:nrune],
    // but sub[i] does not even begin with rune[0].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      Regexp* prefix = Regexp::LiteralString(rune, nrune, runeflags);
      for (int j = start; j < i; j++)
        Regexp::RemoveLeadingString(sub[j], nrune);
      splices->emplace_back(prefix, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      rune = rune_i;
      nrune = nrune_i;
      runeflags = runeflags_i;
    }
  }
}